

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaAig.c
# Opt level: O2

Gia_Man_t * Gia_ManFromAigSimple(Aig_Man_t *p)

{
  int iVar1;
  int iLit1;
  Gia_Man_t *p_00;
  char *pcVar2;
  Aig_Obj_t *pObj;
  uint uVar3;
  int i;
  
  p_00 = Gia_ManStart(p->vObjs->nSize - p->nDeleted);
  pcVar2 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar2;
  pcVar2 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar2;
  p_00->nConstrs = p->nConstrs;
  Aig_ManCleanData(p);
  i = 0;
  do {
    if (p->vObjs->nSize <= i) {
      Gia_ManSetRegNum(p_00,p->nRegs);
      return p_00;
    }
    pObj = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,i);
    if (pObj != (Aig_Obj_t *)0x0) {
      uVar3 = (uint)*(undefined8 *)&pObj->field_0x18 & 7;
      if (uVar3 == 2) {
        iVar1 = Gia_ManAppendCi(p_00);
      }
      else if (uVar3 == 3) {
        iVar1 = Gia_ObjChild0Copy(pObj);
        iVar1 = Gia_ManAppendCo(p_00,iVar1);
      }
      else if (uVar3 == 5) {
        iVar1 = Gia_ObjChild0Copy(pObj);
        iLit1 = Gia_ObjChild1Copy(pObj);
        iVar1 = Gia_ManAppendAnd(p_00,iVar1,iLit1);
      }
      else {
        if (((ulong)pObj & 1) != 0) {
          __assert_fail("!Aig_IsComplement(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aig.h"
                        ,0x112,"int Aig_ObjIsConst1(Aig_Obj_t *)");
        }
        iVar1 = 1;
        if (uVar3 != 1) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaAig.c"
                        ,0xc3,"Gia_Man_t *Gia_ManFromAigSimple(Aig_Man_t *)");
        }
      }
      (pObj->field_5).iData = iVar1;
    }
    i = i + 1;
  } while( true );
}

Assistant:

Gia_Man_t * Gia_ManFromAigSimple( Aig_Man_t * p )
{
    Gia_Man_t * pNew;
    Aig_Obj_t * pObj;
    int i;
    // create the new manager
    pNew = Gia_ManStart( Aig_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    pNew->nConstrs = p->nConstrs;
    // create the PIs
    Aig_ManCleanData( p );
    Aig_ManForEachObj( p, pObj, i )
    {
        if ( Aig_ObjIsAnd(pObj) )
            pObj->iData = Gia_ManAppendAnd( pNew, Gia_ObjChild0Copy(pObj), Gia_ObjChild1Copy(pObj) );
        else if ( Aig_ObjIsCi(pObj) )
            pObj->iData = Gia_ManAppendCi( pNew );
        else if ( Aig_ObjIsCo(pObj) )
            pObj->iData = Gia_ManAppendCo( pNew, Gia_ObjChild0Copy(pObj) );
        else if ( Aig_ObjIsConst1(pObj) )
            pObj->iData = 1;
        else
            assert( 0 );
    }
    Gia_ManSetRegNum( pNew, Aig_ManRegNum(p) );
    return pNew;
}